

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalPiecewiseMergeJoin::PhysicalPiecewiseMergeJoin
          (PhysicalPiecewiseMergeJoin *this,LogicalComparisonJoin *op,PhysicalOperator *left,
          PhysicalOperator *right,vector<duckdb::JoinCondition,_true> *cond,JoinType join_type,
          idx_t estimated_cardinality)

{
  pointer pEVar1;
  ulong uVar2;
  NotImplementedException *this_00;
  pointer pJVar3;
  pointer this_01;
  allocator local_a1;
  PhysicalPiecewiseMergeJoin *local_a0;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_98;
  vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *local_90;
  vector<duckdb::LogicalType,_true> *local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  string local_70;
  pointer local_50;
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalRangeJoin::PhysicalRangeJoin
            (&this->super_PhysicalRangeJoin,op,PIECEWISE_MERGE_JOIN,left,right,
             (vector<duckdb::JoinCondition,_true> *)&local_48,join_type,estimated_cardinality);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_48);
  (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
  super_CachingPhysicalOperator.super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalPiecewiseMergeJoin_027b2b78;
  local_88 = &this->join_key_types;
  local_90 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
             &this->lhs_orders;
  local_98 = (vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
             &this->rhs_orders;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->join_key_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs_orders).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pJVar3 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_a0 = this;
  local_50 = pJVar3;
  while( true ) {
    if (this_01 == pJVar3) {
      return;
    }
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_01->left);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&local_88->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar1->return_type);
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_01->left);
    (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_78,pEVar1);
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_01->right);
    (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_80,pEVar1);
    uVar2 = (ulong)this_01->comparison;
    if (0x25 < uVar2) break;
    if ((0x28000000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x50000000UL >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x2004000000U >> (uVar2 & 0x3f) & 1) == 0) break;
        local_70._M_dataplus._M_p._0_1_ = 0;
        local_a1 = (allocator)0x3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_90,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_78);
        local_70._M_dataplus._M_p._0_1_ = 0;
        local_a1 = (allocator)0x3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_98,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_80);
      }
      else {
        local_70._M_dataplus._M_p._0_1_ = 3;
        local_a1 = (allocator)0x3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_90,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_78);
        local_70._M_dataplus._M_p._0_1_ = 3;
        local_a1 = (allocator)0x3;
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (local_98,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_80);
        pJVar3 = local_50;
      }
    }
    else {
      local_70._M_dataplus._M_p._0_1_ = 2;
      local_a1 = (allocator)0x3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (local_90,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_78);
      local_70._M_dataplus._M_p._0_1_ = 2;
      local_a1 = (allocator)0x3;
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                (local_98,(OrderType *)&local_70,(OrderByNullType *)&local_a1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_80);
    }
    if (local_80._M_head_impl != (Expression *)0x0) {
      (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_78._M_head_impl != (Expression *)0x0) {
      (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    this_01 = this_01 + 1;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_70,"Unimplemented join type for merge join",&local_a1);
  NotImplementedException::NotImplementedException(this_00,&local_70);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PhysicalPiecewiseMergeJoin::PhysicalPiecewiseMergeJoin(LogicalComparisonJoin &op, PhysicalOperator &left,
                                                       PhysicalOperator &right, vector<JoinCondition> cond,
                                                       JoinType join_type, idx_t estimated_cardinality)
    : PhysicalRangeJoin(op, PhysicalOperatorType::PIECEWISE_MERGE_JOIN, left, right, std::move(cond), join_type,
                        estimated_cardinality) {

	for (auto &cond : conditions) {
		D_ASSERT(cond.left->return_type == cond.right->return_type);
		join_key_types.push_back(cond.left->return_type);

		// Convert the conditions to sort orders
		auto left = cond.left->Copy();
		auto right = cond.right->Copy();
		switch (cond.comparison) {
		case ExpressionType::COMPARE_LESSTHAN:
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			lhs_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(left));
			rhs_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(right));
			break;
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			lhs_orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_LAST, std::move(left));
			rhs_orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_LAST, std::move(right));
			break;
		case ExpressionType::COMPARE_NOTEQUAL:
		case ExpressionType::COMPARE_DISTINCT_FROM:
			// Allowed in multi-predicate joins, but can't be first/sort.
			D_ASSERT(!lhs_orders.empty());
			lhs_orders.emplace_back(OrderType::INVALID, OrderByNullType::NULLS_LAST, std::move(left));
			rhs_orders.emplace_back(OrderType::INVALID, OrderByNullType::NULLS_LAST, std::move(right));
			break;

		default:
			// COMPARE EQUAL not supported with merge join
			throw NotImplementedException("Unimplemented join type for merge join");
		}
	}
}